

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::array_n
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  uint uVar1;
  uint uVar2;
  pointer __s;
  long lVar3;
  ulong __n;
  
  uVar2 = 1;
  lVar3 = 2;
  do {
    uVar1 = obj->_dims[lVar3 + -2];
    this->_dims[lVar3 + -2] = uVar1;
    uVar2 = uVar2 * uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 3);
  __n = (ulong)uVar2;
  if (uVar2 == 0) {
    __s = (pointer)0x0;
  }
  else {
    __s = (pointer)operator_new(__n);
    this->first = __s;
    memset(__s,0,__n);
    this->last = __s + __n;
  }
  this->_array = __s;
  memcpy(__s,obj->_array,__n);
  return;
}

Assistant:

array_n(const array_n &obj) {
            unsigned int n = 1;

            // Copy dims
            for(int i = 0; i < N; i++) {
                _dims[i] = obj._dims[i];
                n *= _dims[i];
            }

            // Allocate for ourselves
            _alloc(n);

            // Copy everything to our array
            memcpy(_array, obj._array, n*sizeof(T));
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }